

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_3> __thiscall
tcu::refract<float,3>(tcu *this,Vector<float,_3> *i,Vector<float,_3> *n,float eta)

{
  float fVar1;
  Vector<float,_3> *a;
  undefined8 extraout_XMM0_Qa;
  double dVar2;
  float fVar3;
  Vector<float,_3> VVar4;
  Vector<float,_3> VVar5;
  Vector<float,_3> local_44;
  Vector<float,_3> local_38;
  float local_2c;
  float local_28;
  float k;
  float cosAngle;
  float eta_local;
  Vector<float,_3> *n_local;
  Vector<float,_3> *i_local;
  undefined8 uVar6;
  float fVar7;
  
  k = eta;
  _cosAngle = n;
  n_local = i;
  i_local = (Vector<float,_3> *)this;
  local_28 = dot<float,3>(n,i);
  fVar3 = 1.0;
  local_2c = -(k * k) * (-local_28 * local_28 + 1.0) + 1.0;
  if (0.0 <= local_2c) {
    operator*((tcu *)&local_38,n_local,k);
    a = _cosAngle;
    fVar1 = k;
    fVar3 = local_28;
    dVar2 = std::sqrt((double)(ulong)(uint)local_2c);
    operator*((tcu *)&local_44,a,fVar1 * fVar3 + SUB84(dVar2,0));
    VVar4 = operator-(this,&local_38,&local_44);
  }
  else {
    Vector<float,_3>::Vector((Vector<float,_3> *)this,0.0);
    VVar4.m_data[2] = fVar3;
    VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  uVar6._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  return (Vector<float,_3>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}